

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::~TSMuxer(TSMuxer *this)

{
  TSMuxer *this_local;
  
  if (this->m_outBuf != (uint8_t *)0x0) {
    operator_delete__(this->m_outBuf);
  }
  if (((this->m_isExternalFile & 1U) == 0) && (this->m_muxFile != (AbstractOutputStream *)0x0)) {
    (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[1])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_fileNames);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            (&this->m_priorityData);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->m_interleaveInfo);
  std::__cxx11::string::~string((string *)&this->m_outFileName);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_muxedPacketCnt);
  MemoryBlock::~MemoryBlock(&this->m_pesData);
  std::
  map<int,_unsigned_char,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>::
  ~map(&this->m_pesType);
  TS_program_association_section::~TS_program_association_section(&this->m_pat);
  TS_program_map_section::~TS_program_map_section(&this->m_pmt);
  std::
  map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  ::~map(&this->m_streamInfo);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            (&this->m_extIndexToTSIndex);
  std::vector<long,_std::allocator<long>_>::~vector(&this->m_firstPts);
  std::vector<long,_std::allocator<long>_>::~vector(&this->m_lastPts);
  std::vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>::
  ~vector(&this->m_m2tsDelayBlocks);
  AbstractMuxer::~AbstractMuxer(&this->super_AbstractMuxer);
  return;
}

Assistant:

TSMuxer::~TSMuxer()
{
    delete[] m_outBuf;
    if (!m_isExternalFile)
        delete m_muxFile;
}